

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key,char **value)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  char *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  ByteData data;
  ByteData key_data;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  ByteData *in_stack_fffffffffffffd28;
  ByteData *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd50;
  CfdException *this;
  string *in_stack_fffffffffffffd90;
  string local_238;
  undefined1 local_212;
  undefined1 local_211 [33];
  CfdSourceLocation local_1f0;
  string *in_stack_fffffffffffffe38;
  pointer in_stack_fffffffffffffe40;
  ByteData local_1a8;
  ByteData local_190;
  allocator local_171;
  string local_170;
  ByteData local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  CfdSourceLocation local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  undefined8 *local_30;
  char *local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"PsbtHandle",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x8f1;
    local_90.funcname = "CfdGetPsbtRecord";
    cfd::core::logger::warn<>(&local_90,"key is null or empty.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. key is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,error_code,in_stack_fffffffffffffd40);
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (undefined8 *)0x0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x8f7;
    local_d0.funcname = "CfdGetPsbtRecord";
    cfd::core::logger::warn<>(&local_d0,"value is null.");
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to parameter. value is null.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,error_code,in_stack_fffffffffffffd40);
    local_f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_78 + 0x18) == 0) {
    local_110.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_110.filename = local_110.filename + 1;
    local_110.line = 0x8fd;
    local_110.funcname = "CfdGetPsbtRecord";
    cfd::core::logger::warn<>(&local_110,"psbt is null.");
    local_132 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Failed to handle statement. psbt is null.",&local_131);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,error_code,in_stack_fffffffffffffd40);
    local_132 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,local_28,&local_171);
  cfd::core::ByteData::ByteData(&local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  cfd::core::ByteData::ByteData(&local_190);
  if (local_1c == 1) {
    cfd::core::Psbt::GetGlobalRecord(&local_1a8,*(Psbt **)(local_78 + 0x18),&local_150);
    cfd::core::ByteData::operator=(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    cfd::core::ByteData::~ByteData((ByteData *)0x5ffa6c);
  }
  else if (local_1c == 2) {
    cfd::core::Psbt::GetTxInRecord
              ((ByteData *)&stack0xfffffffffffffe40,*(Psbt **)(local_78 + 0x18),local_20,&local_150)
    ;
    cfd::core::ByteData::operator=(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    cfd::core::ByteData::~ByteData((ByteData *)0x5ffad6);
  }
  else {
    if (local_1c != 3) {
      local_1f0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_1f0.filename = local_1f0.filename + 1;
      local_1f0.line = 0x910;
      local_1f0.funcname = "CfdGetPsbtRecord";
      cfd::core::logger::warn<int&>(&local_1f0,"type is invalid: {}",&local_1c);
      local_212 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      this = (CfdException *)local_211;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_211 + 1),"Failed to parameter. type is invalid.",(allocator *)this
                );
      cfd::core::CfdException::CfdException
                (this,(CfdError)((ulong)uVar2 >> 0x20),in_stack_fffffffffffffd40);
      local_212 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Psbt::GetTxOutRecord
              ((ByteData *)&stack0xfffffffffffffe28,*(Psbt **)(local_78 + 0x18),local_20,&local_150)
    ;
    cfd::core::ByteData::operator=(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    cfd::core::ByteData::~ByteData((ByteData *)0x5ffb27);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_238,&local_190);
  pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffd90);
  *local_30 = pcVar3;
  std::__cxx11::string::~string((string *)&local_238);
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x5ffcc1);
  cfd::core::ByteData::~ByteData((ByteData *)0x5ffcce);
  return local_4;
}

Assistant:

int CfdGetPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index, const char* key,
    char** value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (value == nullptr) {
      warn(CFD_LOG_SOURCE, "value is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    ByteData data;
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        data = psbt_obj->psbt->GetGlobalRecord(key_data);
        break;
      case kCfdPsbtRecordTypeInput:
        data = psbt_obj->psbt->GetTxInRecord(index, key_data);
        break;
      case kCfdPsbtRecordTypeOutput:
        data = psbt_obj->psbt->GetTxOutRecord(index, key_data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    *value = CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}